

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O0

void get_msurf_descriptor_inlinedHaarWavelets(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  int iVar2;
  int scale_00;
  int iVar3;
  int iVar4;
  float *in_RSI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int i_1;
  float norm_factor;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  int sample_x_sub_int_scale;
  float xs_sub_sample_x_squared;
  float xs_sub_sample_x;
  int sample_x;
  int k;
  int sample_y_sub_int_scale;
  float ys_sub_sample_y_squared;
  float ys_sub_sample_y;
  int sample_y;
  int l;
  int ys;
  int xs;
  float mdy;
  float mdx;
  float dy;
  float dx;
  float cy_squared;
  int j;
  float cx_squared;
  int i;
  float cy;
  float cx;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  float ipoint_y;
  float ipoint_x;
  float g2_factor;
  float g1_factor;
  float scale_squared;
  int int_scale;
  float scale;
  int local_c8;
  float fVar32;
  float fVar33;
  int local_88;
  float row;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  int local_54;
  int local_4c;
  float local_48;
  float local_44;
  float local_40;
  int local_3c;
  
  fVar12 = in_RSI[2];
  auVar25._8_4_ = 0x80000000;
  auVar25._0_8_ = 0x8000000080000000;
  auVar25._12_4_ = 0x80000000;
  auVar5._8_4_ = 0x3effffff;
  auVar5._0_8_ = 0x3effffff3effffff;
  auVar5._12_4_ = 0x3effffff;
  auVar5 = vpternlogd_avx512vl(auVar5,ZEXT416((uint)fVar12),auVar25,0xf8);
  auVar5 = vroundss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)(fVar12 + auVar5._0_4_)),0xb);
  fVar11 = *in_RSI;
  auVar26._8_4_ = 0x80000000;
  auVar26._0_8_ = 0x8000000080000000;
  auVar26._12_4_ = 0x80000000;
  auVar15._8_4_ = 0x3effffff;
  auVar15._0_8_ = 0x3effffff3effffff;
  auVar15._12_4_ = 0x3effffff;
  auVar6 = vpternlogd_avx512vl(auVar15,ZEXT416((uint)fVar11),auVar26,0xf8);
  auVar6 = vroundss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)(fVar11 + auVar6._0_4_)),0xb);
  auVar8._0_8_ = (double)auVar6._0_4_;
  auVar8._8_8_ = 0;
  auVar6._0_8_ = (double)fVar12;
  auVar6._8_8_ = 0;
  auVar15 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar6,auVar8);
  fVar11 = in_RSI[1];
  auVar27._8_4_ = 0x80000000;
  auVar27._0_8_ = 0x8000000080000000;
  auVar27._12_4_ = 0x80000000;
  auVar7._8_4_ = 0x3effffff;
  auVar7._0_8_ = 0x3effffff3effffff;
  auVar7._12_4_ = 0x3effffff;
  auVar6 = vpternlogd_avx512vl(auVar7,ZEXT416((uint)fVar11),auVar27,0xf8);
  auVar6 = vroundss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)(fVar11 + auVar6._0_4_)),0xb);
  auVar9._0_8_ = (double)auVar6._0_4_;
  auVar9._8_8_ = 0;
  auVar13._0_8_ = (double)fVar12;
  auVar13._8_8_ = 0;
  auVar6 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar13,auVar9);
  local_3c = 0;
  local_40 = 0.0;
  local_44 = -2.5;
  for (local_4c = -8; local_4c < 8; local_4c = local_4c + 5) {
    local_44 = local_44 + 1.0;
    local_48 = -2.5;
    for (local_54 = -8; local_54 < 8; local_54 = local_54 + 5) {
      local_48 = local_48 + 1.0;
      local_5c = 0.0;
      local_60 = 0.0;
      local_64 = 0.0;
      local_68 = 0.0;
      auVar16._0_4_ = (float)local_4c;
      auVar16._4_12_ = SUB6412(ZEXT1664((undefined1  [16])0x0),4);
      auVar13 = vfmadd213ss_fma(ZEXT416((uint)fVar12),auVar16,ZEXT416((uint)(float)auVar15._0_8_));
      auVar28._8_4_ = 0x80000000;
      auVar28._0_8_ = 0x8000000080000000;
      auVar28._12_4_ = 0x80000000;
      auVar17._8_4_ = 0x3effffff;
      auVar17._0_8_ = 0x3effffff3effffff;
      auVar17._12_4_ = 0x3effffff;
      auVar7 = vpternlogd_avx512vl(auVar17,auVar13,auVar28,0xf8);
      auVar13 = vroundss_avx(auVar13,ZEXT416((uint)(auVar13._0_4_ + auVar7._0_4_)),0xb);
      auVar18._0_4_ = (float)local_54;
      auVar18._4_12_ = auVar13._4_12_;
      auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar12),auVar18,ZEXT416((uint)(float)auVar6._0_8_));
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar19._8_4_ = 0x3effffff;
      auVar19._0_8_ = 0x3effffff3effffff;
      auVar19._12_4_ = 0x3effffff;
      auVar8 = vpternlogd_avx512vl(auVar19,auVar7,auVar29,0xf8);
      auVar7 = vroundss_avx(auVar7,ZEXT416((uint)(auVar7._0_4_ + auVar8._0_4_)),0xb);
      auVar14 = ZEXT1664(auVar7);
      for (iVar1 = local_54 + -4; iVar1 < local_54 + 5; iVar1 = iVar1 + 1) {
        auVar20._0_4_ = (float)iVar1;
        auVar20._4_12_ = auVar14._4_12_;
        auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar12),auVar20,ZEXT416((uint)(float)auVar6._0_8_));
        auVar30._8_4_ = 0x80000000;
        auVar30._0_8_ = 0x8000000080000000;
        auVar30._12_4_ = 0x80000000;
        auVar21._8_4_ = 0x3effffff;
        auVar21._0_8_ = 0x3effffff3effffff;
        auVar21._12_4_ = 0x3effffff;
        auVar9 = vpternlogd_avx512vl(auVar21,auVar8,auVar30,0xf8);
        auVar8 = vroundss_avx(auVar8,ZEXT416((uint)(auVar8._0_4_ + auVar9._0_4_)),0xb);
        iVar2 = (int)auVar8._0_4_;
        row = (float)(int)auVar7._0_4_ - (float)iVar2;
        fVar11 = row * row;
        scale_00 = iVar2 - (int)auVar5._0_4_;
        for (local_88 = local_4c + -4; auVar14 = ZEXT464(0), local_88 < local_4c + 5;
            local_88 = local_88 + 1) {
          auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar12),ZEXT416((uint)(float)local_88),
                                   ZEXT416((uint)(float)auVar15._0_8_));
          auVar31._8_4_ = 0x80000000;
          auVar31._0_8_ = 0x8000000080000000;
          auVar31._12_4_ = 0x80000000;
          auVar22._8_4_ = 0x3effffff;
          auVar22._0_8_ = 0x3effffff3effffff;
          auVar22._12_4_ = 0x3effffff;
          auVar9 = vpternlogd_avx512vl(auVar22,auVar8,auVar31,0xf8);
          auVar8 = vroundss_avx(auVar8,ZEXT416((uint)(auVar8._0_4_ + auVar9._0_4_)),0xb);
          iVar3 = (int)auVar8._0_4_;
          fVar33 = (float)(int)auVar13._0_4_ - (float)iVar3;
          fVar32 = fVar33 * fVar33;
          iVar4 = iVar3 - (int)auVar5._0_4_;
          fVar10 = expf((-0.08 / (fVar12 * fVar12)) * (fVar32 + fVar11));
          haarXY((integral_image *)CONCAT44(iVar1,iVar2),(int)row,(int)fVar11,scale_00,
                 (float *)CONCAT44(iVar3,fVar33),(float *)CONCAT44(fVar32,iVar4));
          local_5c = fVar10 * 0.0 + local_5c;
          local_60 = fVar10 * 0.0 + local_60;
          auVar23._8_4_ = 0x7fffffff;
          auVar23._0_8_ = 0x7fffffff7fffffff;
          auVar23._12_4_ = 0x7fffffff;
          auVar8 = vpand_avx(ZEXT416((uint)(fVar10 * 0.0)),auVar23);
          local_64 = auVar8._0_4_ + local_64;
          auVar24._8_4_ = 0x7fffffff;
          auVar24._0_8_ = 0x7fffffff7fffffff;
          auVar24._12_4_ = 0x7fffffff;
          auVar8 = vpand_avx(ZEXT416((uint)(fVar10 * 0.0)),auVar24);
          local_68 = auVar8._0_4_ + local_68;
        }
      }
      fVar11 = expf((local_44 * local_44 + local_48 * local_48) * -0.22222222);
      local_5c = local_5c * fVar11;
      local_60 = local_60 * fVar11;
      local_64 = local_64 * fVar11;
      local_68 = local_68 * fVar11;
      in_RSI[(long)local_3c + 5] = local_5c;
      in_RSI[(long)(local_3c + 1) + 5] = local_60;
      in_RSI[(long)(local_3c + 2) + 5] = local_64;
      in_RSI[(long)(local_3c + 3) + 5] = local_68;
      auVar13 = vfmadd213ss_fma(ZEXT416((uint)local_5c),ZEXT416((uint)local_5c),
                                ZEXT416((uint)(local_60 * local_60)));
      auVar13 = vfmadd213ss_fma(ZEXT416((uint)local_64),ZEXT416((uint)local_64),auVar13);
      auVar13 = vfmadd213ss_fma(ZEXT416((uint)local_68),ZEXT416((uint)local_68),auVar13);
      local_40 = auVar13._0_4_ + local_40;
      local_3c = local_3c + 4;
    }
  }
  fVar12 = sqrtf(local_40);
  for (local_c8 = 0; local_c8 < 0x40; local_c8 = local_c8 + 1) {
    in_RSI[(long)local_c8 + 5] = (1.0 / fVar12) * in_RSI[(long)local_c8 + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_inlinedHaarWavelets(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_inlined
        - using haarXY function to compute Haar Wavelet responses at once
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -2.5f;
    float cy;

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        float cx_squared = cx*cx;
        
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            float cy_squared = cy*cy;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                int sample_y_sub_int_scale = sample_y-int_scale;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    //Get the gaussian weighted x and y responses
                    // NOTE: We use expf here
                    float gauss_s1 = expf(g1_factor * (xs_sub_sample_x_squared + ys_sub_sample_y_squared));
                    
                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    // printf("sample_x,y:%i %i int_scale:%i rx:%f ry:%f\n",sample_x_sub_int_scale,sample_y_sub_int_scale, int_scale, rx,ry);

                    // float rx = haarX_improved(iimage, sample_y, sample_x, int_scale*2);
                    // float ry = haarY_improved(iimage, sample_y, sample_x, int_scale*2);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // TODO: (Sebastian) Precompute this...
            // NOTE: We use expf here
            float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}